

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O0

int run_test_metrics_pool_events(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int local_af0;
  undefined4 uStack_aec;
  char rdata;
  int r;
  uv_os_fd_t fd;
  uv_random_t random_req;
  uv_prepare_t prepare;
  uv_metrics_t metrics;
  uv_getaddrinfo_t addrinfo_req;
  uv_fs_t write_req;
  uv_fs_t unlink_req;
  uv_fs_t stat2_req;
  uv_fs_t stat1_req;
  uv_fs_t open_req;
  uv_buf_t iov;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_configure(uVar2,1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x143,"uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME)","==","0",(long)iVar1
            ,"==",0);
    abort();
  }
  uv_fs_unlink(0,&write_req.bufsml[3].len,"test_file");
  uv_fs_req_cleanup(&write_req.bufsml[3].len);
  uVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(uVar2,&random_req.work_req.wq.prev);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x148,"uv_prepare_init(uv_default_loop(), &prepare)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_prepare_start(&random_req.work_req.wq.prev,fs_prepare_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x149,"uv_prepare_start(&prepare, fs_prepare_cb)","==","0",(long)iVar1,"==",0);
    abort();
  }
  pool_events_counter = 0;
  local_af0 = uv_fs_open(0,&stat1_req.bufsml[3].len,"test_file",0x41,0x180);
  if ((long)local_af0 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x150,"r","==","0",(long)local_af0,"==",0);
    abort();
  }
  if ((long)open_req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x151,"open_req.result",">=","0",open_req.cb,">=",0);
    abort();
  }
  uStack_aec = SUB84(open_req.cb,0);
  uv_fs_req_cleanup(&stat1_req.bufsml[3].len);
  open_req.bufsml[3].len = uv_buf_init(test_buf,0xd);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_write(uVar2,&addrinfo_req.retcode,uStack_aec,&open_req.bufsml[3].len,1,0,fs_write_cb
                     );
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x15c,"uv_fs_write(uv_default_loop(), &write_req, fd, &iov, 1, 0, fs_write_cb)","==",
            "0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_stat(uVar2,&stat2_req.bufsml[3].len,"test_file",fs_stat_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x160,"uv_fs_stat(uv_default_loop(), &stat1_req, \"test_file\", fs_stat_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_stat(uVar2,&unlink_req.bufsml[3].len,"test_file",fs_stat_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x164,"uv_fs_stat(uv_default_loop(), &stat2_req, \"test_file\", fs_stat_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_random(uVar2,&r,(long)&eval_a + 7,1,0,fs_random_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x16a,"uv_random(uv_default_loop(), &random_req, &rdata, 1, 0, fs_random_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar2,metrics.reserved + 0xc,fs_addrinfo_cb,"example.invalid",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x170,
            "uv_getaddrinfo(uv_default_loop(), &addrinfo_req, fs_addrinfo_cb, \"example.invalid\", ((void*)0), ((void*)0))"
            ,"==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_sleep(100);
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x176,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_metrics_info(uVar2,&prepare.queue.prev);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x178,"uv_metrics_info(uv_default_loop(), &metrics)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)metrics.loop_count < 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x17c,"metrics.events",">=","7",metrics.loop_count,">=",7);
    abort();
  }
  if ((long)metrics.events < 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x181,"metrics.events_waiting",">=","4",metrics.events,">=",4);
    abort();
  }
  if ((long)pool_events_counter != -0x2a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x182,"pool_events_counter","==","-42",(long)pool_events_counter,"==",
            0xffffffffffffffd6);
    abort();
  }
  uv_fs_unlink(0,&write_req.bufsml[3].len,"test_file");
  uv_fs_req_cleanup(&write_req.bufsml[3].len);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0x187,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(metrics_pool_events) {
  uv_buf_t iov;
  uv_fs_t open_req;
  uv_fs_t stat1_req;
  uv_fs_t stat2_req;
  uv_fs_t unlink_req;
  uv_fs_t write_req;
  uv_getaddrinfo_t addrinfo_req;
  uv_metrics_t metrics;
  uv_prepare_t prepare;
  uv_random_t random_req;
  uv_os_fd_t fd;
  int r;
  char rdata;

  ASSERT_OK(uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME));

  uv_fs_unlink(NULL, &unlink_req, "test_file", NULL);
  uv_fs_req_cleanup(&unlink_req);

  ASSERT_OK(uv_prepare_init(uv_default_loop(), &prepare));
  ASSERT_OK(uv_prepare_start(&prepare, fs_prepare_cb));

  pool_events_counter = 0;
  r = uv_fs_open(NULL,
                  &open_req, "test_file", UV_FS_O_WRONLY | UV_FS_O_CREAT,
                  S_IRUSR | S_IWUSR,
                  NULL);
  ASSERT_EQ(r, 0);
  ASSERT_GE(open_req.result, 0);
  fd = (uv_os_fd_t) open_req.result;
  uv_fs_req_cleanup(&open_req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  ASSERT_OK(uv_fs_write(uv_default_loop(),
                        &write_req,
                        fd,
                        &iov,
                        1,
                        0,
                        fs_write_cb));
  ASSERT_OK(uv_fs_stat(uv_default_loop(),
                       &stat1_req,
                       "test_file",
                       fs_stat_cb));
  ASSERT_OK(uv_fs_stat(uv_default_loop(),
                       &stat2_req,
                       "test_file",
                       fs_stat_cb));
  ASSERT_OK(uv_random(uv_default_loop(),
                      &random_req,
                      &rdata,
                      1,
                      0,
                      fs_random_cb));
  ASSERT_OK(uv_getaddrinfo(uv_default_loop(),
                           &addrinfo_req,
                           fs_addrinfo_cb,
                           "example.invalid",
                           NULL,
                           NULL));

  /* Sleep for a moment to hopefully force the events to complete before
   * entering the event loop. */
  uv_sleep(100);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  /* It's possible for uv__work_done() to execute one extra time even though the
   * QUEUE has already been cleared out. This has to do with the way we use an
   * uv_async to tell the event loop thread to process the worker pool QUEUE. */
  ASSERT_GE(metrics.events, 7);
  /* It's possible one of the other events also got stuck in the event queue, so
   * check GE instead of EQ. Reason for 4 instead of 5 is because the call to
   * uv_getaddrinfo() is racey and slow. So can't guarantee that it'll always
   * execute before sleep completes. */
  ASSERT_GE(metrics.events_waiting, 4);
  ASSERT_EQ(pool_events_counter, -42);

  uv_fs_unlink(NULL, &unlink_req, "test_file", NULL);
  uv_fs_req_cleanup(&unlink_req);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}